

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
LinkedReadsDatastore::get_tags_kmers
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,LinkedReadsDatastore *this,int k,int min_tag_cov,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *tags,
          ReadSequenceBuffer *blrsg)

{
  value_type *pvVar1;
  uchar b;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var2;
  _Rb_tree_node_base *p_Var3;
  pointer puVar4;
  uchar *puVar5;
  long lVar6;
  uint64_t *__args;
  char *s;
  value_type *__v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> all_kmers;
  vector<unsigned_long,_std::allocator<unsigned_long>_> read_ids;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  kset;
  StreamKmerFactory skf;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_2e8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_2c8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2b0;
  ReadSequenceBuffer *local_2a8;
  uint64_t *local_2a0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_298;
  KMerFactory local_260;
  
  local_2b0 = &__return_storage_ptr__->_M_h;
  local_2a8 = blrsg;
  KMerFactory::KMerFactory(&local_260,(uint8_t)k);
  local_2e8._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
  local_2e8._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
  local_2e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8._M_impl.super__Vector_impl_data._M_start = (uint64_t *)0x0;
  local_2c8._M_impl.super__Vector_impl_data._M_finish = (uint64_t *)0x0;
  for (p_Var3 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(tags->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    get_tag_reads((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298,this,
                  p_Var3[1]._M_color);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_2c8,
               (const_iterator)local_2c8._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_298._M_buckets,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_298._M_bucket_count);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_298);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2e8,
             ((this->readsize - (long)k) + 1) *
             ((long)local_2c8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_2c8._M_impl.super__Vector_impl_data._M_start >> 3));
  local_2a0 = local_2c8._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = local_2c8._M_impl.super__Vector_impl_data._M_start; puVar4 != local_2a0;
      puVar4 = puVar4 + 1) {
    puVar5 = (uchar *)ReadSequenceBuffer::get_read_sequence(local_2a8,*puVar4);
    local_260.last_unknown = 0;
    local_260.fkmer = 0;
    local_260.rkmer = 0;
    for (; (b = *puVar5, b != '\0' && (b != '\n')); puVar5 = puVar5 + 1) {
      KMerFactory::fillKBuf(&local_260,b,&local_260.fkmer,&local_260.rkmer,&local_260.last_unknown);
      if ((long)(ulong)local_260.K <= local_260.last_unknown) {
        __args = &local_260.fkmer;
        if (local_260.rkmer < local_260.fkmer) {
          __args = &local_260.rkmer;
        }
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_2e8,__args);
      }
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_2e8._M_impl.super__Vector_impl_data._M_start,
             local_2e8._M_impl.super__Vector_impl_data._M_finish);
  local_298._M_buckets = &local_298._M_single_bucket;
  local_298._M_bucket_count = 1;
  local_298._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_298._M_element_count = 0;
  local_298._M_rehash_policy._M_max_load_factor = 1.0;
  local_298._M_rehash_policy._M_next_resize = 0;
  local_298._M_single_bucket = (__node_base_ptr)0x0;
  pvVar1 = local_2e8._M_impl.super__Vector_impl_data._M_start;
  while (__v = pvVar1, p_Var2 = local_2b0, __v < local_2e8._M_impl.super__Vector_impl_data._M_finish
        ) {
    for (lVar6 = 0;
        (pvVar1 = (value_type *)((long)__v + lVar6),
        pvVar1 < local_2e8._M_impl.super__Vector_impl_data._M_finish && (*pvVar1 == *__v));
        lVar6 = lVar6 + 8) {
    }
    if ((long)min_tag_cov <= lVar6 >> 3) {
      std::__detail::
      _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_298,__v);
    }
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(local_2b0,&local_298);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_298);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_2c8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_2e8);
  return (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)p_Var2;
}

Assistant:

std::unordered_set<uint64_t> LinkedReadsDatastore::get_tags_kmers(int k, int min_tag_cov, std::set<LinkedTag> tags, ReadSequenceBuffer & blrsg) {
    class StreamKmerFactory : public  KMerFactory {
    public:
        explicit StreamKmerFactory(uint8_t k) : KMerFactory(k){}
        inline void produce_all_kmers(const char * seq, std::vector<uint64_t> &mers){
            // TODO: Adjust for when K is larger than what fits in uint64_t!
            last_unknown=0;
            fkmer=0;
            rkmer=0;
            auto s=seq;
            while (*s!='\0' and *s!='\n') {
                //fkmer: grows from the right (LSB)
                //rkmer: grows from the left (MSB)
                fillKBuf(*s, fkmer, rkmer, last_unknown);
                if (last_unknown >= K) {
                    if (fkmer <= rkmer) {
                        // Is fwd
                        mers.emplace_back(fkmer);
                    } else {
                        // Is bwd
                        mers.emplace_back(rkmer);
                    }
                }
                ++s;
            }
        }
    };
    StreamKmerFactory skf(k);

    //reserve space by counting reads first, save only the integer, do not merge just count and insert in the set
    std::vector<uint64_t> all_kmers;
    std::vector<uint64_t> read_ids;
    for (auto t:tags) {
        auto reads=get_tag_reads(t);
        read_ids.insert(read_ids.end(),reads.begin(),reads.end());
    }
    all_kmers.reserve(read_ids.size()*(readsize-k+1));
    for (auto rid:read_ids){
            skf.produce_all_kmers(blrsg.get_read_sequence(rid),all_kmers);
    }
    std::sort(all_kmers.begin(),all_kmers.end());
    std::unordered_set<uint64_t> kset;
    auto ri=all_kmers.begin();
    auto nri=all_kmers.begin();
    while (ri<all_kmers.end()){
        while (nri<all_kmers.end() and *nri==*ri) ++nri;
        if (nri-ri>=min_tag_cov) kset.insert(*ri);
        ri=nri;
    }
    return std::move(kset);
}